

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Builder * __thiscall
capnp::Orphan<capnp::DynamicList>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicList> *this)

{
  uint8_t uVar1;
  undefined2 uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  anon_union_8_2_eba6ea51_for_Type_5 aVar3;
  SegmentBuilder *pSVar8;
  CapTableBuilder *pCVar9;
  StructPointerCount SVar10;
  undefined1 uVar11;
  ListElementCount LVar12;
  BitsPerElementN<23> BVar13;
  ElementSize EVar14;
  Which elementType;
  uint uVar15;
  ushort uVar16;
  ListBuilder *__return_storage_ptr___00;
  Schema local_b0;
  Reader local_a8;
  ListBuilder local_78;
  ListBuilder local_50;
  
  uVar1 = (this->schema).elementType.listDepth;
  uVar2 = (this->schema).elementType.baseType;
  uVar4 = (this->schema).elementType.listDepth;
  uVar5 = (this->schema).elementType.isImplicitParam;
  uVar6 = (this->schema).elementType.field_3;
  uVar7 = *(undefined2 *)&(this->schema).elementType.field_0x6;
  aVar3 = (this->schema).elementType.field_4;
  if ((uVar1 == '\0') && ((this->schema).elementType.baseType == STRUCT)) {
    local_b0.raw = (RawBrandedSchema *)Type::asStruct((Type *)this);
    Schema::getProto(&local_a8,&local_b0);
    uVar15 = 0;
    if (local_a8._reader.dataSize < 0x80) {
      uVar16 = 0;
    }
    else {
      uVar16 = *(ushort *)((long)local_a8._reader.data + 0xe);
      if (0xcf < local_a8._reader.dataSize) {
        uVar15 = (uint)*(ushort *)((long)local_a8._reader.data + 0x18) << 0x10;
      }
    }
    __return_storage_ptr___00 = &local_50;
    _::OrphanBuilder::asStructList
              (__return_storage_ptr___00,&this->builder,(StructSize)(uVar16 | uVar15));
  }
  else {
    elementType = LIST;
    if (uVar1 == '\0') {
      elementType = uVar2;
    }
    EVar14 = anon_unknown_71::elementSizeFor(elementType);
    __return_storage_ptr___00 = &local_78;
    _::OrphanBuilder::asList(__return_storage_ptr___00,&this->builder,EVar14);
  }
  SVar10 = __return_storage_ptr___00->structPointerCount;
  EVar14 = __return_storage_ptr___00->elementSize;
  uVar11 = __return_storage_ptr___00->field_0x27;
  (__return_storage_ptr__->builder).structDataSize = __return_storage_ptr___00->structDataSize;
  (__return_storage_ptr__->builder).structPointerCount = SVar10;
  (__return_storage_ptr__->builder).elementSize = EVar14;
  (__return_storage_ptr__->builder).field_0x27 = uVar11;
  pSVar8 = __return_storage_ptr___00->segment;
  pCVar9 = __return_storage_ptr___00->capTable;
  LVar12 = __return_storage_ptr___00->elementCount;
  BVar13 = __return_storage_ptr___00->step;
  (__return_storage_ptr__->builder).ptr = __return_storage_ptr___00->ptr;
  (__return_storage_ptr__->builder).elementCount = LVar12;
  (__return_storage_ptr__->builder).step = BVar13;
  (__return_storage_ptr__->builder).segment = pSVar8;
  (__return_storage_ptr__->builder).capTable = pCVar9;
  (__return_storage_ptr__->schema).elementType.baseType = uVar2;
  (__return_storage_ptr__->schema).elementType.listDepth = uVar4;
  (__return_storage_ptr__->schema).elementType.isImplicitParam = (bool)uVar5;
  (__return_storage_ptr__->schema).elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)uVar6;
  *(undefined2 *)&(__return_storage_ptr__->schema).elementType.field_0x6 = uVar7;
  (__return_storage_ptr__->schema).elementType.field_4 = aVar3;
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Builder Orphan<DynamicList>::get() {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return DynamicList::Builder(
        schema, builder.asStructList(structSizeFromSchema(schema.getStructElementType())));
  } else {
    return DynamicList::Builder(
        schema, builder.asList(elementSizeFor(schema.whichElementType())));
  }
}